

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

bool __thiscall gl3cts::TransformFeedback::LinkingErrors::testInvalidVarying(LinkingErrors *this)

{
  ostringstream *poVar1;
  GLint GVar2;
  int iVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  MessageBuilder *pMVar5;
  allocator<char> local_295;
  GLint linking_status;
  string vertex_shader;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  iVar3 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertex_shader,s_vertex_shader_template,(allocator<char> *)local_1b0);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&vertex_shader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"TEMPLATE_INPUT_OUTPUT_DECLARATIONS",
             (allocator<char> *)&linking_status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"in float data;\n",&local_295);
  Utilities::preprocessCode((string *)local_1b0,&local_1d0,&local_1f0,&local_210);
  std::__cxx11::string::operator=((string *)&vertex_shader,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_230,(string *)&vertex_shader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"TEMPLATE_OUTPUT_SETTERS",(allocator<char> *)&linking_status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,glcts::fixed_sample_locations_values + 1,&local_295);
  Utilities::preprocessCode((string *)local_1b0,&local_230,&local_250,&local_270);
  std::__cxx11::string::operator=((string *)&vertex_shader,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  linking_status = 1;
  GVar4 = Utilities::buildProgram
                    ((Functions *)CONCAT44(extraout_var,iVar3),this->m_context->m_testCtx->m_log,
                     (GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,vertex_shader._M_dataplus._M_p,
                     s_fragment_shader,&s_invalid_transform_feedback_varying,1,0x8c8c,false,
                     &linking_status);
  GVar2 = linking_status;
  if (linking_status == 0 && GVar4 == 0) {
    local_1b0._0_8_ = this->m_context->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Linking failed as expected when Transform Feedback varying was specified with name of variable ("
                   );
    pMVar5 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&s_invalid_transform_feedback_varying);
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ") that is not available for capture.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  else {
    local_1b0._0_8_ = this->m_context->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Linking unexpectedly succeded when Transform Feedback varying was specified with name of variable ("
                   );
    pMVar5 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&s_invalid_transform_feedback_varying);
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ") that is not available for capture.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    if (GVar4 != 0) {
      (*((Functions *)CONCAT44(extraout_var,iVar3))->deleteProgram)(GVar4);
    }
  }
  std::__cxx11::string::~string((string *)&vertex_shader);
  return GVar2 == 0 && GVar4 == 0;
}

Assistant:

bool gl3cts::TransformFeedback::LinkingErrors::testInvalidVarying(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/*  Check if link process fails under the following conditions:
	 <varyings> specified by TransformFeedbackVaryings contains name of
	 variable that is not available for capture; */

	std::string vertex_shader(s_vertex_shader_template);

	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(
		vertex_shader, "TEMPLATE_INPUT_OUTPUT_DECLARATIONS", "in float data;\n");
	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(vertex_shader, "TEMPLATE_OUTPUT_SETTERS", "");

	glw::GLint linking_status = 1;

	glw::GLuint program = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, vertex_shader.c_str(), s_fragment_shader,
		&s_invalid_transform_feedback_varying, 1, GL_INTERLEAVED_ATTRIBS, false, &linking_status);

	if ((GL_FALSE != linking_status) || program)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Linking unexpectedly succeded when Transform Feedback varying was specified with name of variable ("
			<< s_invalid_transform_feedback_varying << ") that is not available for capture."
			<< tcu::TestLog::EndMessage;

		if (program)
		{
			gl.deleteProgram(program);
		}

		return false;
	}

	/* Log success. */
	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Linking failed as expected when Transform Feedback varying was specified with name of variable ("
		<< s_invalid_transform_feedback_varying << ") that is not available for capture." << tcu::TestLog::EndMessage;

	return true;
}